

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O3

int __thiscall VVCStreamReader::intDecodeNAL(VVCStreamReader *this,uint8_t *buff)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  VvcSpsUnit *this_00;
  VvcPpsUnit *this_01;
  byte bVar5;
  byte *pbVar6;
  MemoryBlock *dst;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  
  (this->super_MPEGStreamReader).m_spsPpsFound = false;
  this->m_lastIFrame = false;
  pbVar3 = NALUnit::findNextNAL
                     (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  bVar5 = (this->super_MPEGStreamReader).m_eof;
  pbVar6 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  if ((pbVar3 != pbVar6 | bVar5) == 1) {
    if (buff < pbVar6) {
      bVar1 = false;
      pbVar7 = (byte *)0x0;
      do {
        uVar8 = (uint)(*buff >> 1);
        uVar9 = uVar8 & 0x3f;
        this_00 = this->m_sps;
        this_01 = this->m_pps;
        pbVar10 = pbVar3;
        if ((this_01 == (VvcPpsUnit *)0x0 || this_00 == (VvcSpsUnit *)0x0) || (0x1f < uVar9)) {
LAB_001f01fa:
          if (bVar1) {
            incTimings(this);
            (this->super_MPEGStreamReader).m_lastDecodedPos = pbVar7;
            goto LAB_001f0497;
          }
          pbVar6 = pbVar3 + -3;
          if (pbVar3[-4] == 0) {
            pbVar6 = pbVar3 + -4;
          }
          if ((byte)uVar9 == 0x10) {
            if (this_01 == (VvcPpsUnit *)0x0) {
              this_01 = (VvcPpsUnit *)operator_new(0x40);
              VvcPpsUnit::VvcPpsUnit(this_01);
              this->m_pps = this_01;
            }
            VvcUnit::decodeBuffer(&this_01->super_VvcUnit,buff,pbVar6);
            iVar2 = VvcPpsUnit::deserialize(this->m_pps);
            if (iVar2 != 0) {
              return iVar2;
            }
            (this->super_MPEGStreamReader).m_spsPpsFound = true;
            dst = &this->m_ppsBuffer;
          }
          else if (uVar9 == 0xf) {
            if (this_00 == (VvcSpsUnit *)0x0) {
              this_00 = (VvcSpsUnit *)operator_new(0xa8);
              VvcSpsUnit::VvcSpsUnit(this_00);
              this->m_sps = this_00;
            }
            VvcUnit::decodeBuffer((VvcUnit *)this_00,buff,pbVar6);
            iVar2 = VvcSpsUnit::deserialize(this->m_sps);
            if (iVar2 != 0) {
              return iVar2;
            }
            (this->super_MPEGStreamReader).m_spsPpsFound = true;
            MPEGStreamReader::updateFPS(&this->super_MPEGStreamReader,this->m_sps,buff,pbVar6,0);
            dst = &this->m_spsBuffer;
          }
          else {
            if (uVar9 != 0xe) goto LAB_001f0441;
            VvcUnit::decodeBuffer((VvcUnit *)this->m_vps,buff,pbVar6);
            iVar2 = VvcVpsUnit::deserialize(this->m_vps);
            if (iVar2 != 0) {
              return iVar2;
            }
            (this->super_MPEGStreamReader).m_spsPpsFound = true;
            this->m_vpsCounter = this->m_vpsCounter + 1;
            this->m_vpsSizeDiff = 0;
            if (this->m_vps->num_units_in_tick == 0) {
              lVar4 = 0;
            }
            else {
              MPEGStreamReader::updateFPS(&this->super_MPEGStreamReader,this->m_vps,buff,pbVar6,0);
              lVar4 = (long)this->m_vpsSizeDiff;
            }
            pbVar3 = pbVar3 + lVar4;
            dst = &this->m_vpsBuffer;
          }
          storeBuffer(dst,buff,pbVar6);
          pbVar10 = pbVar3;
        }
        else if ((0x78fU >> (uVar8 & 0x1f) & 1) == 0) {
          if ((0xcb640000U >> (uVar8 & 0x1f) & 1) == 0) goto LAB_001f01fa;
        }
        else if ((char)buff[2] < '\0') {
          if (bVar1) {
            (this->super_MPEGStreamReader).m_lastDecodedPos = pbVar7;
            incTimings(this);
            goto LAB_001f0497;
          }
          pbVar6 = buff + 0x40;
          if (pbVar3 < buff + 0x40) {
            pbVar6 = pbVar3;
          }
          VvcUnit::decodeBuffer(&this->m_slice->super_VvcUnit,buff,pbVar6);
          iVar2 = VvcSliceHeader::deserialize(this->m_slice,this->m_sps,this->m_pps);
          if (iVar2 != 0) {
            return iVar2;
          }
          if (6 < (byte)uVar9) {
            this->m_lastIFrame = true;
          }
          iVar2 = toFullPicOrder(this,this->m_slice,(uint)this->m_sps->log2_max_pic_order_cnt_lsb);
          this->m_fullPicOrder = iVar2;
          bVar1 = true;
        }
        else {
          bVar1 = true;
        }
LAB_001f0441:
        pbVar3 = NALUnit::findNextNAL
                           (pbVar10,(this->super_MPEGStreamReader).super_AbstractStreamReader.
                                    m_bufEnd);
        bVar5 = (this->super_MPEGStreamReader).m_eof;
        pbVar6 = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
        if (((bool)bVar5 == false) && (pbVar3 == pbVar6)) goto LAB_001f047e;
        pbVar7 = buff;
        buff = pbVar10;
      } while (pbVar10 < pbVar6);
    }
    iVar2 = 1;
    if (bVar5 != 0) {
      (this->super_MPEGStreamReader).m_lastDecodedPos = pbVar6;
LAB_001f0497:
      iVar2 = 0;
    }
  }
  else {
LAB_001f047e:
    iVar2 = -10;
  }
  return iVar2;
}

Assistant:

int VVCStreamReader::intDecodeNAL(uint8_t* buff)
{
    int rez;
    bool sliceFound = false;
    m_spsPpsFound = false;
    m_lastIFrame = false;

    const uint8_t* prevPos = nullptr;
    uint8_t* curPos = buff;
    uint8_t* nextNal = NALUnit::findNextNAL(curPos, m_bufEnd);

    if (!m_eof && nextNal == m_bufEnd)
        return NOT_ENOUGH_BUFFER;

    while (curPos < m_bufEnd)
    {
        const auto nalType = static_cast<VvcUnit::NalType>((*curPos >> 1) & 0x3f);
        if (isSlice(nalType))
        {
            if (curPos[2] & 0x80)  // slice.first_slice
            {
                if (sliceFound)
                {  // first slice of next frame: case where there is no non-VCL NAL between the two frames
                    m_lastDecodedPos = prevPos;  // next frame started
                    incTimings();
                    return 0;
                }
                // first slice of current frame
                m_slice->decodeBuffer(curPos, FFMIN(curPos + MAX_SLICE_HEADER, nextNal));
                rez = m_slice->deserialize(m_sps, m_pps);
                if (rez)
                    return rez;  // not enough buffer or error
                if (nalType >= VvcUnit::NalType::IDR_W_RADL)
                    m_lastIFrame = true;
                m_fullPicOrder = toFullPicOrder(m_slice, m_sps->log2_max_pic_order_cnt_lsb);
            }
            sliceFound = true;
        }
        else if (!isSuffix(nalType))
        {  // first non-VCL prefix NAL (AUD, SEI...) following current frame
            if (sliceFound)
            {
                incTimings();
                m_lastDecodedPos = prevPos;  // next frame started
                return 0;
            }

            uint8_t* nextNalWithStartCode = nextNal[-4] == 0 ? nextNal - 4 : nextNal - 3;

            switch (nalType)
            {
            case VvcUnit::NalType::VPS:
                m_vps->decodeBuffer(curPos, nextNalWithStartCode);
                rez = m_vps->deserialize();
                if (rez)
                    return rez;
                m_spsPpsFound = true;
                m_vpsCounter++;
                m_vpsSizeDiff = 0;
                if (m_vps->num_units_in_tick)
                    updateFPS(m_vps, curPos, nextNalWithStartCode, 0);
                nextNal += m_vpsSizeDiff;
                storeBuffer(m_vpsBuffer, curPos, nextNalWithStartCode);
                break;
            case VvcUnit::NalType::SPS:
                if (!m_sps)
                    m_sps = new VvcSpsUnit();
                m_sps->decodeBuffer(curPos, nextNalWithStartCode);
                rez = m_sps->deserialize();
                if (rez)
                    return rez;
                m_spsPpsFound = true;
                updateFPS(m_sps, curPos, nextNalWithStartCode, 0);
                storeBuffer(m_spsBuffer, curPos, nextNalWithStartCode);
                break;
            case VvcUnit::NalType::PPS:
                if (!m_pps)
                    m_pps = new VvcPpsUnit();
                m_pps->decodeBuffer(curPos, nextNalWithStartCode);
                rez = m_pps->deserialize();
                if (rez)
                    return rez;
                m_spsPpsFound = true;
                storeBuffer(m_ppsBuffer, curPos, nextNalWithStartCode);
                break;
            default:
                break;
            }
        }
        prevPos = curPos;
        curPos = nextNal;
        nextNal = NALUnit::findNextNAL(curPos, m_bufEnd);

        if (!m_eof && nextNal == m_bufEnd)
            return NOT_ENOUGH_BUFFER;
    }
    if (m_eof)
    {
        m_lastDecodedPos = m_bufEnd;
        return 0;
    }
    return NEED_MORE_DATA;
}